

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapper_2.cpp
# Opt level: O1

void __thiscall
n_e_s::core::Mapper2::Mapper2
          (Mapper2 *this,INesHeader *h,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *prg_rom,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *chr_mem)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  invalid_argument *this_00;
  
  (this->super_IRom)._vptr_IRom = (_func_int **)&PTR__IRom_00132b30;
  uVar1 = h->nes[1];
  uVar2 = h->nes[2];
  uVar3 = h->nes[3];
  uVar4 = h->prg_rom_size;
  uVar5 = h->chr_rom_size;
  uVar6 = h->flags_6;
  uVar7 = h->flags_7;
  uVar8 = h->prg_ram_size;
  uVar9 = h->flags_9;
  uVar10 = h->flags_10;
  uVar11 = h->zeros[0];
  uVar12 = h->zeros[1];
  uVar13 = h->zeros[2];
  uVar14 = h->zeros[3];
  uVar15 = h->zeros[4];
  (this->super_IRom).header_.nes[0] = h->nes[0];
  (this->super_IRom).header_.nes[1] = uVar1;
  (this->super_IRom).header_.nes[2] = uVar2;
  (this->super_IRom).header_.nes[3] = uVar3;
  (this->super_IRom).header_.prg_rom_size = uVar4;
  (this->super_IRom).header_.chr_rom_size = uVar5;
  (this->super_IRom).header_.flags_6 = uVar6;
  (this->super_IRom).header_.flags_7 = uVar7;
  (this->super_IRom).header_.prg_ram_size = uVar8;
  (this->super_IRom).header_.flags_9 = uVar9;
  (this->super_IRom).header_.flags_10 = uVar10;
  (this->super_IRom).header_.zeros[0] = uVar11;
  (this->super_IRom).header_.zeros[1] = uVar12;
  (this->super_IRom).header_.zeros[2] = uVar13;
  (this->super_IRom).header_.zeros[3] = uVar14;
  (this->super_IRom).header_.zeros[4] = uVar15;
  (this->super_IRom)._vptr_IRom = (_func_int **)&PTR__Mapper2_00132b80;
  this->select_bank_low_ = '\0';
  this->select_bank_hi_ = h->prg_rom_size + 0xff;
  (this->prg_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (prg_rom->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->prg_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (prg_rom->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  (this->prg_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (prg_rom->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (prg_rom->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (prg_rom->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (prg_rom->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->chr_mem_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (chr_mem->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (this->chr_mem_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (chr_mem->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  (this->chr_mem_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (chr_mem->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (chr_mem->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (chr_mem->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (chr_mem->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  memset(&this->nametables_,0,0x800);
  if ((long)(this->prg_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->prg_rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start == (ulong)h->prg_rom_size * 0x4000) {
    if ((long)(this->chr_mem_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(this->chr_mem_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start == 0x2000) {
      return;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Invalid chr_ram size");
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Invalid prg_rom size");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Mapper2::Mapper2(const INesHeader &h,
        std::vector<uint8_t> prg_rom,
        std::vector<uint8_t> chr_mem)
        : IRom(h),
          select_bank_hi_(h.prg_rom_size - 1),
          prg_rom_(std::move(prg_rom)),
          chr_mem_(std::move(chr_mem)),
          nametables_{} {
    if (prg_rom_.size() !=
            static_cast<std::size_t>(16u * 1024u * h.prg_rom_size)) {
        throw std::invalid_argument("Invalid prg_rom size");
    }

    if (chr_mem_.size() != static_cast<std::size_t>(8u * 1024u)) {
        throw std::invalid_argument("Invalid chr_ram size");
    }
}